

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_mutex.cpp
# Opt level: O1

Mutex * __thiscall MutexPool::get(MutexPool *this,void *address)

{
  Mutex *pMVar1;
  int iVar2;
  
  Mutex::lock(&this->mutex_);
  iVar2 = (int)(((ulong)address >> 4) % this->size_);
  pMVar1 = this->mutexes_[iVar2];
  if (pMVar1 == (Mutex *)0x0) {
    pMVar1 = (Mutex *)operator_new(0x30);
    Mutex::Mutex(pMVar1);
    this->mutexes_[iVar2] = pMVar1;
    pMVar1 = this->mutexes_[iVar2];
  }
  Mutex::unlock(&this->mutex_);
  return pMVar1;
}

Assistant:

Mutex &MutexPool::get(const void *address)
{
	Lock lock(mutex_);

	size_t index = int(((size_t)(void *)(address) >> (sizeof(address) >> 1)) % size_);

#if MUTEX_POOL_CHECK_FOR_DEADLOCKS
	index = 0;
#endif

	Mutex *m = mutexes_[index];

	if (!m) {
		mutexes_[index] = new Mutex;
		m = mutexes_[index];
	}

	return *m;
}